

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O1

SpirVAsmSource * __thiscall
vk::ProgramCollection<vk::SpirVAsmSource>::add
          (ProgramCollection<vk::SpirVAsmSource> *this,string *name)

{
  mapped_type pSVar1;
  mapped_type *ppSVar2;
  MovePtr<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_> prog;
  UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_> local_28;
  
  pSVar1 = (mapped_type)operator_new(0x20);
  (pSVar1->source)._M_dataplus._M_p = (pointer)&(pSVar1->source).field_2;
  (pSVar1->source)._M_string_length = 0;
  (pSVar1->source).field_2._M_local_buf[0] = '\0';
  local_28.m_data.ptr = pSVar1;
  ppSVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>_>
            ::operator[](&this->m_programs,name);
  *ppSVar2 = pSVar1;
  local_28.m_data.ptr = (SpirVAsmSource *)0x0;
  ppSVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>_>
            ::operator[](&this->m_programs,name);
  pSVar1 = *ppSVar2;
  de::details::UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>::reset
            (&local_28);
  return pSVar1;
}

Assistant:

Program& ProgramCollection<Program>::add (const std::string& name)
{
	DE_ASSERT(!contains(name));
	de::MovePtr<Program> prog = de::newMovePtr<Program>();
	m_programs[name] = prog.get();
	prog.release();
	return *m_programs[name];
}